

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagHelperMethodWrapper.cpp
# Opt level: O0

void Js::HandleHelperOrLibraryMethodWrapperException<false>
               (ScriptContext *scriptContext,JavascriptExceptionObject *exceptionObject)

{
  code *pcVar1;
  int iVar2;
  bool bVar3;
  uint32 uVar4;
  uint functionNumber;
  undefined4 *puVar5;
  ThreadContext *pTVar6;
  JavascriptExceptionObject *pJVar7;
  DebugContext *this;
  ProbeContainer *this_00;
  DebugManager *this_01;
  DebuggingFlags *this_02;
  FunctionBody *pFVar8;
  undefined1 local_38 [8];
  ByteCodeReader reader;
  int offsetFromDebugger;
  int nextStatementOffset;
  JavascriptExceptionObject *exceptionObject_local;
  ScriptContext *scriptContext_local;
  
  if (scriptContext == (ScriptContext *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd3,"(scriptContext)","scriptContext");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  if (exceptionObject == (JavascriptExceptionObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                ,0xd4,"(exceptionObject)","exceptionObject");
    if (!bVar3) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar5 = 0;
  }
  bVar3 = JavascriptExceptionObject::IsDebuggerSkip(exceptionObject);
  if (bVar3) {
    pTVar6 = ScriptContext::GetThreadContext(scriptContext);
    pJVar7 = ThreadContext::GetPendingOOMErrorObject(pTVar6);
    if (exceptionObject != pJVar7) {
      pTVar6 = ScriptContext::GetThreadContext(scriptContext);
      pJVar7 = ThreadContext::GetPendingSOErrorObject(pTVar6);
      if (exceptionObject != pJVar7) {
        bVar3 = JavascriptExceptionObject::IsDebuggerSkip(exceptionObject);
        if (!bVar3) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 1;
          bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Debug/DiagHelperMethodWrapper.cpp"
                                      ,0xf0,"(exceptionObject->IsDebuggerSkip())",
                                      "exceptionObject->IsDebuggerSkip()");
          if (!bVar3) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          puVar5 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
          *puVar5 = 0;
        }
        reader.m_endLocation._0_4_ =
             JavascriptExceptionObject::GetByteCodeOffsetAfterDebuggerSkip(exceptionObject);
        iVar2 = (int)reader.m_endLocation;
        if ((int)reader.m_endLocation == -1) {
          pFVar8 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
          uVar4 = JavascriptExceptionObject::GetByteCodeOffset(exceptionObject);
          ByteCodeReader::Create((ByteCodeReader *)local_38,pFVar8,uVar4);
          this = ScriptContext::GetDebugContext(scriptContext);
          this_00 = DebugContext::GetProbeContainer(this);
          pFVar8 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
          uVar4 = JavascriptExceptionObject::GetByteCodeOffset(exceptionObject);
          bVar3 = ProbeContainer::GetNextUserStatementOffsetForAdvance
                            (this_00,pFVar8,(ByteCodeReader *)local_38,uVar4,
                             (int *)((long)&reader.m_endLocation + 4));
          iVar2 = reader.m_endLocation._4_4_;
          if (!bVar3) {
            JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject,scriptContext);
          }
        }
        reader.m_endLocation._4_4_ = iVar2;
        pTVar6 = ScriptContext::GetThreadContext(scriptContext);
        this_01 = ThreadContext::GetDebugManager(pTVar6);
        this_02 = DebugManager::GetDebuggingFlags(this_01);
        iVar2 = reader.m_endLocation._4_4_;
        pFVar8 = JavascriptExceptionObject::GetFunctionBody(exceptionObject);
        functionNumber = FunctionProxy::GetFunctionNumber((FunctionProxy *)pFVar8);
        DebuggingFlags::SetByteCodeOffsetAndFuncAfterIgnoreException(this_02,iVar2,functionNumber);
        return;
      }
    }
  }
  JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject,scriptContext);
}

Assistant:

void HandleHelperOrLibraryMethodWrapperException(ScriptContext * scriptContext, JavascriptExceptionObject * exceptionObject)
    {
        Assert(scriptContext);
        Assert(exceptionObject);

        // Note: there also could be plain OutOfMemoryException and StackOverflowException, no special handling for these.
        if (!exceptionObject->IsDebuggerSkip() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingOOMErrorObject() ||
            exceptionObject == scriptContext->GetThreadContext()->GetPendingSOErrorObject())
        {
            JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
        }

        if (doCheckParentInterpreterFrame)
        {
            // Note: JavascriptStackWalker is slow, but this is not hot path at all.
            // Note: we treat internal script code (such as Intl) as library code, thus
            //       ignore isLibraryCode=true callers.
            bool isTopUserFrameNative;
            bool isTopUserFrameJavaScript = Js::JavascriptStackWalker::TryIsTopJavaScriptFrameNative(
                scriptContext, &isTopUserFrameNative, /* ignoreLibraryCode = */ true);
            AssertMsg(isTopUserFrameJavaScript, "How could we get non-javascript frame on exception?");

            if (isTopUserFrameJavaScript && !isTopUserFrameNative)
            {
                // If parent frame is interpreter frame, it already has try-catch around all calls,
                // so that we don't need any special handling here.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        Assert(exceptionObject->IsDebuggerSkip());
        int nextStatementOffset;
        int offsetFromDebugger = exceptionObject->GetByteCodeOffsetAfterDebuggerSkip();
        if (offsetFromDebugger != DebuggingFlags::InvalidByteCodeOffset)
        {
            // The offset is already set for us by debugger (such as by set next statement).
            nextStatementOffset = offsetFromDebugger;
        }
        else
        {
            ByteCodeReader reader;
            reader.Create(exceptionObject->GetFunctionBody(), exceptionObject->GetByteCodeOffset());
            // Determine offset for next statement here.
            if (!scriptContext->GetDebugContext()->GetProbeContainer()->GetNextUserStatementOffsetForAdvance(
                exceptionObject->GetFunctionBody(), &reader, exceptionObject->GetByteCodeOffset(), &nextStatementOffset))
            {
                // Can't advance.
                JavascriptExceptionOperators::DoThrowCheckClone(exceptionObject, scriptContext);
            }
        }

        // Continue after exception.
        // Note: for this scenario InterpreterStackFrame::DebugProcess resets its state,
        // looks like we don't need to that because we start with brand new interpreter frame.

        // Indicate to bailout check that we should bail out for/into debugger and set the byte code offset to one of next statement.
        scriptContext->GetThreadContext()->GetDebugManager()->GetDebuggingFlags()->SetByteCodeOffsetAndFuncAfterIgnoreException(
            nextStatementOffset, exceptionObject->GetFunctionBody()->GetFunctionNumber());
    }